

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse2.h
# Opt level: O0

void round_shift_16bit(__m128i *in,int size,int bit)

{
  undefined1 auVar1 [16];
  undefined2 uVar2;
  __m128i alVar3;
  int local_c0;
  int local_bc;
  char local_a8;
  int i_1;
  int i;
  __m128i rounding;
  int bit_local;
  int size_local;
  __m128i *in_local;
  
  if (bit < 0) {
    local_a8 = (char)-bit;
    uVar2 = (undefined2)(1 << (local_a8 - 1U & 0x1f));
    auVar1._2_2_ = uVar2;
    auVar1._0_2_ = uVar2;
    auVar1._4_2_ = uVar2;
    auVar1._6_2_ = uVar2;
    auVar1._10_2_ = uVar2;
    auVar1._8_2_ = uVar2;
    auVar1._12_2_ = uVar2;
    auVar1._14_2_ = uVar2;
    for (local_bc = 0; local_bc < size; local_bc = local_bc + 1) {
      alVar3 = (__m128i)paddsw((undefined1  [16])in[local_bc],auVar1);
      in[local_bc] = alVar3;
      alVar3 = (__m128i)psraw((undefined1  [16])in[local_bc],ZEXT416((uint)-bit));
      in[local_bc] = alVar3;
    }
  }
  else if (0 < bit) {
    for (local_c0 = 0; local_c0 < size; local_c0 = local_c0 + 1) {
      alVar3 = (__m128i)psllw((undefined1  [16])in[local_c0],ZEXT416((uint)bit));
      in[local_c0] = alVar3;
    }
  }
  return;
}

Assistant:

static inline void round_shift_16bit(__m128i *in, int size, int bit) {
  if (bit < 0) {
    bit = -bit;
    __m128i rounding = _mm_set1_epi16(1 << (bit - 1));
    for (int i = 0; i < size; ++i) {
      in[i] = _mm_adds_epi16(in[i], rounding);
      in[i] = _mm_srai_epi16(in[i], bit);
    }
  } else if (bit > 0) {
    for (int i = 0; i < size; ++i) {
      in[i] = _mm_slli_epi16(in[i], bit);
    }
  }
}